

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void square_memorize_traps(chunk *c,loc grid)

{
  trap_kind *ptVar1;
  loc lVar2;
  uint8_t uVar3;
  bitflag bVar4;
  bitflag bVar5;
  bitflag bVar6;
  undefined3 uVar7;
  uint8_t uVar8;
  undefined7 uVar9;
  _Bool _Var10;
  square *psVar11;
  trap *ptVar12;
  trap *ptVar13;
  trap *ptVar14;
  trap **pptVar15;
  
  psVar11 = square((chunk_conflict *)c,grid);
  if ((chunk *)cave == c) {
    ptVar13 = psVar11->trap;
    square_remove_all_traps((chunk *)player->cave,grid);
    psVar11 = square((chunk_conflict *)player->cave,grid);
    flag_off(psVar11->info,3,9);
    if (ptVar13 != (trap *)0x0) {
      ptVar14 = (trap *)0x0;
      do {
        _Var10 = square_isvisibletrap((chunk_conflict *)c,grid);
        ptVar12 = ptVar14;
        if (_Var10) {
          ptVar12 = (trap *)mem_zalloc(0x28);
          if (ptVar14 == (trap *)0x0) {
            pptVar15 = &player->cave->squares[(long)grid >> 0x20][grid.x].trap;
          }
          else {
            pptVar15 = &ptVar14->next;
          }
          *pptVar15 = ptVar12;
          uVar8 = ptVar13->t_idx;
          uVar9 = *(undefined7 *)&ptVar13->field_0x1;
          ptVar1 = ptVar13->kind;
          lVar2 = ptVar13->grid;
          ptVar12->next = ptVar13->next;
          ptVar12->grid = lVar2;
          uVar3 = ptVar13->timeout;
          bVar4 = ptVar13->flags[0];
          bVar5 = ptVar13->flags[1];
          bVar6 = ptVar13->flags[2];
          uVar7 = *(undefined3 *)&ptVar13->field_0x25;
          ptVar12->power = ptVar13->power;
          ptVar12->timeout = uVar3;
          ptVar12->flags[0] = bVar4;
          ptVar12->flags[1] = bVar5;
          ptVar12->flags[2] = bVar6;
          *(undefined3 *)&ptVar12->field_0x25 = uVar7;
          ptVar12->t_idx = uVar8;
          *(undefined7 *)&ptVar12->field_0x1 = uVar9;
          ptVar12->kind = ptVar1;
          ptVar12->next = (trap *)0x0;
        }
        ptVar13 = ptVar13->next;
        ptVar14 = ptVar12;
      } while (ptVar13 != (trap *)0x0);
    }
    psVar11 = square((chunk_conflict *)player->cave,grid);
    if (psVar11->trap != (trap *)0x0) {
      psVar11 = square((chunk_conflict *)player->cave,grid);
      flag_on_dbg(psVar11->info,3,9,"square(player->cave, grid)->info","SQUARE_TRAP");
      return;
    }
  }
  return;
}

Assistant:

void square_memorize_traps(struct chunk *c, struct loc grid)
{
	struct trap *trap = square(c, grid)->trap;
	struct trap *current = NULL;
	if (c != cave) return;

	/* Clear current knowledge */
	square_remove_all_traps(player->cave, grid);
	sqinfo_off(square(player->cave, grid)->info, SQUARE_TRAP);

	/* Copy all visible traps to the known cave */
	while (trap) {
		if (square_isvisibletrap(c, grid)) {
			struct trap *next;
			if (current) {
				next = mem_zalloc(sizeof(*next));
				current->next = next;
				current = next;
			} else {
				current = mem_zalloc(sizeof(*current));
				player->cave->squares[grid.y][grid.x].trap = current;
			}
			memcpy(current, trap, sizeof(*trap));
			current->next = NULL;
		}
		trap = trap->next;
	}
	if (square(player->cave, grid)->trap) {
		sqinfo_on(square(player->cave, grid)->info, SQUARE_TRAP);
	}
}